

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O3

bool __thiscall
ON_ComponentManifestTableIndex::AddItemAndSetManifestIndex
          (ON_ComponentManifestTableIndex *this,ON_ComponentManifestItem_PRIVATE *item)

{
  ON_ComponentManifestItem_PRIVATE *pOVar1;
  char *sFormat;
  ON_ComponentManifestItem_PRIVATE **ppOVar2;
  int line_number;
  ON_ComponentManifestItem_PRIVATE *local_18;
  
  if (item != (ON_ComponentManifestItem_PRIVATE *)0x0) {
    local_18 = item;
    if (item->m_manifest_table_sn == 0) {
      if ((this->m_component_type != Unset) &&
         (this->m_component_type == (item->super_ON_ComponentManifestItem).m_component_type)) {
        if (this->m_bIndexedComponent == true) {
          (item->super_ON_ComponentManifestItem).m_index = (this->m_item_list).m_count;
          ON_SimpleArray<const_ON_ComponentManifestItem_PRIVATE_*>::Append
                    (&this->m_item_list,&local_18);
        }
        else {
          (item->super_ON_ComponentManifestItem).m_index = -0x7fffffff;
        }
        pOVar1 = this->m_last_item;
        ppOVar2 = &pOVar1->m_next;
        if (pOVar1 == (ON_ComponentManifestItem_PRIVATE *)0x0) {
          ppOVar2 = &this->m_first_item;
        }
        *ppOVar2 = local_18;
        local_18->m_prev = pOVar1;
        this->m_last_item = local_18;
        local_18->m_next = (ON_ComponentManifestItem_PRIVATE *)0x0;
        local_18->m_manifest_table_sn = this->m_manifest_table_sn;
        this->m_active_and_deleted_item_count = this->m_active_and_deleted_item_count + 1;
        if (((local_18->super_ON_ComponentManifestItem).m_status_bits & 1) != 0) {
          this->m_deleted_item_count = this->m_deleted_item_count + 1;
          return true;
        }
        return true;
      }
      sFormat = "Item has component type.";
      line_number = 0xc4c;
    }
    else {
      sFormat = "item is already in a table";
      line_number = 0xc46;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
               ,line_number,"",sFormat);
  }
  return false;
}

Assistant:

bool ON_ComponentManifestTableIndex::AddItemAndSetManifestIndex(
  ON_ComponentManifestItem_PRIVATE* item
  )
{
  if ( nullptr == item )
    return false;

  if (0 != item->m_manifest_table_sn)
  {
    ON_ERROR("item is already in a table");
    return false;
  }
  
  if (m_component_type != item->ComponentType() || ON_ModelComponent::Type::Unset == m_component_type)
  {
    ON_ERROR("Item has component type.");
    return false;
  }

  if (m_bIndexedComponent)
  {
    item->SetIndex(m_item_list.Count());
    m_item_list.Append(item);
  }
  else
  {
    item->SetIndex(ON_UNSET_INT_INDEX);
  }
  
  if (nullptr == m_last_item)
  {
    m_first_item = item;
    item->m_prev = nullptr;
  }
  else
  {
    m_last_item->m_next = item;
    item->m_prev = m_last_item;
  }
  m_last_item = item;
  item->m_next = nullptr;
  
  item->m_manifest_table_sn = m_manifest_table_sn;
  m_active_and_deleted_item_count++;

  if (item->IsDeleted())
    IncrementDeletedCount();

  return true;
}